

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysutil.c
# Opt level: O3

int read_timeout(int fd,uint wait_seconds)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  timeval timeout;
  fd_set read_fdset;
  timeval local_b8;
  fd_set local_a8;
  
  if (wait_seconds == 0) {
    return 0;
  }
  local_a8.fds_bits[0] = 0;
  local_a8.fds_bits[1] = 0;
  local_a8.fds_bits[2] = 0;
  local_a8.fds_bits[3] = 0;
  local_a8.fds_bits[4] = 0;
  local_a8.fds_bits[5] = 0;
  local_a8.fds_bits[6] = 0;
  local_a8.fds_bits[7] = 0;
  local_a8.fds_bits[8] = 0;
  local_a8.fds_bits[9] = 0;
  local_a8.fds_bits[10] = 0;
  local_a8.fds_bits[0xb] = 0;
  iVar1 = fd + 0x3f;
  if (-1 < fd) {
    iVar1 = fd;
  }
  local_a8.fds_bits[0xc] = 0;
  local_a8.fds_bits[0xd] = 0;
  local_a8.fds_bits[0xe] = 0;
  local_a8.fds_bits[0xf] = 0;
  local_a8.fds_bits[iVar1 >> 6] = local_a8.fds_bits[iVar1 >> 6] | 1L << ((byte)(fd % 0x40) & 0x3f);
  local_b8.tv_sec = (__time_t)wait_seconds;
  local_b8.tv_usec = 0;
  do {
    iVar1 = select(fd + 1,&local_a8,(fd_set *)0x0,(fd_set *)0x0,&local_b8);
    if (-1 < iVar1) {
      if (iVar1 == 0) {
        piVar3 = __errno_location();
        *piVar3 = 0x6e;
        return -1;
      }
      break;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  iVar2 = 0;
  if (iVar1 != 1) {
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

int read_timeout(int fd, unsigned int wait_seconds) {
  int ret = 0;
  if (wait_seconds > 0) {
    fd_set read_fdset;
    struct timeval timeout;

    FD_ZERO(&read_fdset);
    FD_SET(fd, &read_fdset);

    timeout.tv_sec = wait_seconds;
    timeout.tv_usec = 0;
    do {
      ret = select(fd + 1, &read_fdset, NULL, NULL, &timeout);
    } while (ret < 0 && errno == EINTR);

    if (ret == 0) {
      ret = -1;
      errno = ETIMEDOUT;
    } else if (ret == 1)
      ret = 0;
  }

  return ret;
}